

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_mm_arith(jit_State *J,RecordIndex *ix,MMS mm)

{
  uint32_t uVar1;
  undefined8 uVar2;
  BCReg BVar3;
  int iVar4;
  jit_State *J_00;
  undefined8 *puVar5;
  int in_EDX;
  jit_State *in_RSI;
  long in_RDI;
  TValue *basev;
  TRef *base;
  BCReg func;
  undefined4 in_stack_ffffffffffffff28;
  MMS mm_00;
  RecordIndex *in_stack_ffffffffffffffd0;
  jit_State *in_stack_ffffffffffffffd8;
  
  BVar3 = rec_mm_prep(in_RSI,(ASMFunction)CONCAT44(in_EDX,in_stack_ffffffffffffff28));
  J_00 = (jit_State *)(*(long *)(in_RDI + 0x88) + (ulong)BVar3 * 4);
  puVar5 = (undefined8 *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + (ulong)BVar3 * 8);
  uVar1 = (in_RSI->cur).startpt.gcptr32;
  (J_00->cur).marked = (char)uVar1;
  (J_00->cur).gct = (char)(uVar1 >> 8);
  (J_00->cur).nsnap = (short)(uVar1 >> 0x10);
  (J_00->cur).nins = (in_RSI->cur).startpc.ptr32;
  puVar5[1] = *(undefined8 *)&in_RSI->cur;
  uVar2 = *(undefined8 *)(in_RDI + 0x68);
  puVar5[2] = *(undefined8 *)&(in_RSI->cur).nins;
  mm_00 = (MMS)((ulong)uVar2 >> 0x20);
  iVar4 = lj_record_mm_lookup(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,mm_00);
  if (iVar4 == 0) {
    if (in_EDX != 0x10) {
      (in_RSI->cur).startpt.gcptr32 = (in_RSI->cur).startpc.ptr32;
      uVar2._0_4_ = (in_RSI->cur).nins;
      uVar2._4_4_ = (in_RSI->cur).gclist;
      (in_RSI->cur).nextgc = (GCRef)(undefined4)uVar2;
      (in_RSI->cur).marked = (char)((ulong)uVar2 >> 0x20);
      (in_RSI->cur).gct = (char)((ulong)uVar2 >> 0x28);
      (in_RSI->cur).nsnap = (short)((ulong)uVar2 >> 0x30);
      iVar4 = lj_record_mm_lookup(in_RSI,(RecordIndex *)"copy of dead GC object",mm_00);
      if (iVar4 != 0) goto LAB_001a227d;
    }
    lj_trace_err(J_00,(TraceError)((ulong)puVar5 >> 0x20));
  }
LAB_001a227d:
  (J_00->cur).nextgc.gcptr32 = *(uint32_t *)&(in_RSI->cur).mcode;
  *puVar5 = *(undefined8 *)&(in_RSI->cur).nk;
  lj_record_call(J_00,(BCReg)((ulong)puVar5 >> 0x20),0x1a22fd);
  return 0;
}

Assistant:

static TRef rec_mm_arith(jit_State *J, RecordIndex *ix, MMS mm)
{
  /* Set up metamethod call first to save ix->tab and ix->tabv. */
  BCReg func = rec_mm_prep(J, mm == MM_concat ? lj_cont_cat : lj_cont_ra);
  TRef *base = J->base + func;
  TValue *basev = J->L->base + func;
  base[1+LJ_FR2] = ix->tab; base[2+LJ_FR2] = ix->key;
  copyTV(J->L, basev+1+LJ_FR2, &ix->tabv);
  copyTV(J->L, basev+2+LJ_FR2, &ix->keyv);
  if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
    if (mm != MM_unm) {
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto ok;
    }
    lj_trace_err(J, LJ_TRERR_NOMM);
  }
ok:
  base[0] = ix->mobj;
#if LJ_FR2
  base[1] = 0;
#endif
  copyTV(J->L, basev+0, &ix->mobjv);
  lj_record_call(J, func, 2);
  return 0;  /* No result yet. */
}